

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O2

int main(void)

{
  long lVar1;
  int iVar2;
  UserData data;
  N_Vector yy;
  N_Vector yp;
  long *plVar3;
  void *mem_00;
  void *returnvalue;
  void *returnvalue_00;
  int iVar4;
  int retval;
  SUNContext ctx;
  N_Vector local_a8;
  long *local_a0;
  void *local_98;
  void *local_90;
  UserData local_88;
  sunrealtype tret;
  void *mem;
  long ncfn;
  long netf;
  long nnf;
  long nni;
  long nreLS;
  long nre;
  long nje;
  long nst;
  
  retval = SUNContext_Create(0,&ctx);
  iVar4 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    data = (UserData)malloc(0x40);
    data->a = 0.5;
    data->J1 = 1.0;
    data->J2 = 2.0;
    data->m2 = 1.0;
    *(undefined4 *)&data->k = 0;
    *(undefined4 *)((long)&data->k + 4) = 0x3ff00000;
    *(undefined4 *)&data->c = 0;
    *(undefined4 *)((long)&data->c + 4) = 0x3ff00000;
    *(undefined4 *)&data->l0 = 0;
    *(undefined4 *)((long)&data->l0 + 4) = 0x3ff00000;
    *(undefined4 *)&data->F = 0;
    *(undefined4 *)((long)&data->F + 4) = 0x3ff00000;
    yy = (N_Vector)N_VNew_Serial(10,ctx);
    yp = (N_Vector)N_VClone(yy);
    plVar3 = (long *)N_VClone(yy);
    setIC(yy,yp,data);
    N_VConst(0,plVar3);
    lVar1 = *(long *)(*plVar3 + 0x10);
    *(undefined8 *)(lVar1 + 0x40) = 0;
    *(undefined8 *)(lVar1 + 0x48) = 0;
    *(undefined8 *)(lVar1 + 0x30) = 0;
    *(undefined8 *)(lVar1 + 0x38) = 0;
    mem_00 = (void *)IDACreate(ctx);
    local_a8 = yp;
    mem = mem_00;
    retval = IDAInit(0,mem_00,ressc,yy,yp);
    retval = IDASStolerances(0xa0b5ed8d,0xa0b5ed8d,mem_00);
    retval = IDASetUserData(mem_00,data);
    retval = IDASetId(mem_00,plVar3);
    iVar4 = 1;
    retval = IDASetSuppressAlg(mem_00,1);
    returnvalue = (void *)SUNDenseMatrix(10,10,ctx);
    iVar2 = check_retval(returnvalue,"SUNDenseMatrix",0);
    if (iVar2 == 0) {
      local_88 = data;
      returnvalue_00 = (void *)SUNLinSol_Dense(yy,returnvalue,ctx);
      iVar2 = check_retval(returnvalue_00,"SUNLinSol_Dense",0);
      if (iVar2 == 0) {
        retval = IDASetLinearSolver(mem_00,returnvalue_00,returnvalue);
        iVar4 = 1;
        iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
        if (iVar2 == 0) {
          local_98 = returnvalue_00;
          local_90 = returnvalue;
          puts("\nidaSlCrank_dns: Slider-Crank DAE serial example problem for IDA");
          puts("Linear solver: DENSE, Jacobian is computed by IDA.");
          printf("Tolerance parameters:  rtol = %g   atol = %g\n",0xa0b5ed8d,0xa0b5ed8d);
          puts("-----------------------------------------------------------------------");
          printf("  t            y1          y2           y3");
          puts("      | nst  k      h");
          puts("-----------------------------------------------------------------------");
          retval = PrintOutput(mem_00,0.0,yy);
          local_a0 = plVar3;
          for (iVar4 = 1; iVar4 != 0x29; iVar4 = iVar4 + 1) {
            retval = IDASolve(SUB84((double)iVar4 * 0.25,0),mem_00,&tret,yy,local_a8,1);
            if (retval < 0) break;
            retval = PrintOutput(mem_00,tret,yy);
          }
          IDAGetNumSteps(mem_00,&nst);
          IDAGetNumResEvals(mem_00,&nre);
          IDAGetNumJacEvals(mem_00,&nje);
          IDAGetNumNonlinSolvIters(mem_00,&nni);
          IDAGetNumErrTestFails(mem_00,&netf);
          IDAGetNumNonlinSolvConvFails(mem_00,&nnf);
          IDAGetNumStepSolveFails(mem_00,&ncfn);
          iVar2 = IDAGetNumLinResEvals(mem_00,&nreLS);
          puts("\nFinal Run Statistics: \n");
          iVar4 = 0;
          printf("Number of steps                    = %ld\n",nst);
          printf("Number of residual evaluations     = %ld\n",nreLS + nre);
          printf("Number of Jacobian evaluations     = %ld\n",nje);
          printf("Number of nonlinear iterations     = %ld\n",nni);
          printf("Number of error test failures      = %ld\n",netf);
          printf("Number of nonlinear conv. failures = %ld\n",nnf);
          printf("Number of step solver failures     = %ld\n",ncfn);
          retval = iVar2;
          free(local_88);
          IDAFree(&mem);
          SUNLinSolFree(local_98);
          SUNMatDestroy(local_90);
          N_VDestroy(yy);
          N_VDestroy(local_a8);
          N_VDestroy(local_a0);
          SUNContext_Free(&ctx);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(void)
{
  UserData data;

  void* mem;
  N_Vector yy, yp, id;
  sunrealtype rtol, atol;
  sunrealtype t0, tf, tout, dt, tret;
  int retval, iout;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  A  = NULL;
  LS = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data */

  data = (UserData)malloc(sizeof *data);

  data->a  = 0.5; /* half-length of crank */
  data->J1 = 1.0; /* crank moment of inertia */
  data->m2 = 1.0; /* mass of connecting rod */
  data->J2 = 2.0; /* moment of inertia of connecting rod */
  data->k  = 1.0; /* spring constant */
  data->c  = 1.0; /* damper constant */
  data->l0 = 1.0; /* spring free length */
  data->F  = 1.0; /* external constant force */

  /* Create N_Vectors */
  yy = N_VNew_Serial(NEQ, ctx);
  yp = N_VClone(yy);
  id = N_VClone(yy);

  /* Consistent IC */
  setIC(yy, yp, data);

  /* ID array */
  N_VConst(ONE, id);
  NV_Ith_S(id, 6) = ZERO;
  NV_Ith_S(id, 7) = ZERO;
  NV_Ith_S(id, 8) = ZERO;
  NV_Ith_S(id, 9) = ZERO;

  /* Tolerances */
  rtol = SUN_RCONST(1.0e-6);
  atol = SUN_RCONST(1.0e-6);

  /* Integration limits */
  t0 = ZERO;
  tf = TEND;
  dt = (tf - t0) / (NOUT - 1);

  /* IDA initialization */
  mem    = IDACreate(ctx);
  retval = IDAInit(mem, ressc, t0, yy, yp);
  retval = IDASStolerances(mem, rtol, atol);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  PrintHeader(rtol, atol, yy);

  /* In loop, call IDASolve, print results, and test for error. */

  retval = PrintOutput(mem, t0, yy);

  tout = dt;
  for (iout = 1; iout < NOUT; iout++)
  {
    tout   = iout * dt;
    retval = IDASolve(mem, tout, &tret, yy, yp, IDA_NORMAL);
    if (retval < 0) { break; }

    retval = PrintOutput(mem, tret, yy);
  }

  retval = PrintFinalStats(mem);

  /* Free memory */

  free(data);
  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(id);
  SUNContext_Free(&ctx);

  return (0);
}